

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O2

RotationY<float> *
qclab::qgates::operator*
          (RotationY<float> *__return_storage_ptr__,RotationY<float> *lhs,RotationY<float> *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (lhs->super_QRotationGate1<float>).super_QGate1<float>.qubit_;
  iVar2 = (*(rhs->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])(rhs);
  if (iVar1 == iVar2) {
    RotationY<float>::operator*=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate1<float>).super_QGate1<float>.qubit_ =
         (lhs->super_QRotationGate1<float>).super_QGate1<float>.qubit_;
    (__return_storage_ptr__->super_QRotationGate1<float>).super_QGate1<float>.field_0xc =
         (lhs->super_QRotationGate1<float>).super_QGate1<float>.field_0xc;
    (__return_storage_ptr__->super_QRotationGate1<float>).rotation_.angle_ =
         (lhs->super_QRotationGate1<float>).rotation_.angle_;
    (__return_storage_ptr__->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
    _vptr_QObject = (_func_int **)&PTR_nbQubits_004cc060;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xb1,"RotationY<T> qclab::qgates::operator*(RotationY<T>, const RotationY<T> &)");
}

Assistant:

RotationY< T > operator*( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }